

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O0

void QGuiApplicationPrivate::processWindowStateChangedEvent(WindowStateChangedEvent *wse)

{
  WindowState WVar1;
  WindowState WVar2;
  QWindow *pQVar3;
  QWindowPrivate *this;
  long in_RDI;
  long in_FS_OFFSET;
  WindowState newEffectiveState;
  WindowState originalEffectiveState;
  QWindowPrivate *windowPrivate;
  QWindow *window;
  QWindowStateChangeEvent e;
  WindowState in_stack_ffffffffffffffac;
  undefined1 isOverride;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QPointer<QWindow>::data((QPointer<QWindow> *)0x369e59);
  if (pQVar3 != (QWindow *)0x0) {
    this = qt_window_private((QWindow *)0x369e74);
    WVar1 = QWindowPrivate::effectiveState
                      ((QFlagsStorageHelper<Qt::WindowState,_4>)SUB84((ulong)this >> 0x20,0));
    (this->windowState).super_QFlagsStorageHelper<Qt::WindowState,_4>.
    super_QFlagsStorage<Qt::WindowState>.i = *(Int *)(in_RDI + 0x28);
    WVar2 = QWindowPrivate::effectiveState
                      ((QFlagsStorageHelper<Qt::WindowState,_4>)SUB84((ulong)this >> 0x20,0));
    if (WVar2 != WVar1) {
      QWindow::windowStateChanged((QWindow *)0x369edc,in_stack_ffffffffffffffac);
    }
    isOverride = (undefined1)(in_stack_ffffffffffffffac >> 0x18);
    QWindowPrivate::updateVisibility(this);
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QWindowStateChangeEvent::QWindowStateChangeEvent
              ((QWindowStateChangeEvent *)CONCAT44(WVar1,WVar2),
               (QFlagsStorageHelper<Qt::WindowState,_4>)SUB84((ulong)this >> 0x20,0),
               (bool)isOverride);
    QCoreApplication::sendSpontaneousEvent((QObject *)pQVar3,(QEvent *)&local_20);
    QWindowStateChangeEvent::~QWindowStateChangeEvent((QWindowStateChangeEvent *)0x369f3f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGuiApplicationPrivate::processWindowStateChangedEvent(QWindowSystemInterfacePrivate::WindowStateChangedEvent *wse)
{
    if (QWindow *window = wse->window.data()) {
        QWindowPrivate *windowPrivate = qt_window_private(window);
        const auto originalEffectiveState = QWindowPrivate::effectiveState(windowPrivate->windowState);

        windowPrivate->windowState = wse->newState;
        const auto newEffectiveState = QWindowPrivate::effectiveState(windowPrivate->windowState);
        if (newEffectiveState != originalEffectiveState)
            emit window->windowStateChanged(newEffectiveState);

        windowPrivate->updateVisibility();

        QWindowStateChangeEvent e(wse->oldState);
        QGuiApplication::sendSpontaneousEvent(window, &e);
    }
}